

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalTexture1DShadowProjBias(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  float fVar6;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  pfVar5 = tcu::Vector<float,_4>::z(c->in);
  fVar6 = *pfVar5;
  pfVar5 = tcu::Vector<float,_4>::w(c->in);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_4>::x(c->in);
  fVar2 = *pfVar5;
  pfVar5 = tcu::Vector<float,_4>::w(c->in);
  fVar3 = *pfVar5;
  fVar4 = p->lod;
  pfVar5 = tcu::Vector<float,_4>::x(c->in + 1);
  fVar6 = texture1DShadow(c,fVar6 / fVar1,fVar2 / fVar3,fVar4 + *pfVar5);
  pfVar5 = tcu::Vector<float,_4>::x(&c->color);
  *pfVar5 = fVar6;
  return;
}

Assistant:

static void		evalTexture1DShadowProjBias			(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture1DShadow(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), p.lod+c.in[1].x()); }